

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a4_aux.c
# Opt level: O3

void matrix_mul_f(MATRIX_f *m1,MATRIX_f *m2,MATRIX_f *out)

{
  float (*pafVar1) [3];
  float (*pafVar2) [3];
  float *pfVar3;
  long lVar4;
  MATRIX_f *pMVar5;
  MATRIX_f *pMVar6;
  float (*pafVar7) [3];
  long lVar8;
  MATRIX_f *pMVar9;
  MATRIX_f local_38;
  
  pMVar5 = m2;
  if (m1 == out) {
    pfVar3 = local_38.t;
    pafVar2 = local_38.v + 2;
    pMVar6 = &local_38;
    pafVar7 = local_38.v + 1;
    m2 = m1;
  }
  else {
    pafVar2 = m1->v + 2;
    pafVar7 = m1->v + 1;
    pfVar3 = m1->t;
    pMVar6 = m1;
    if (m2 != out) goto LAB_00106238;
    pMVar5 = &local_38;
  }
  local_38._32_8_ = *(undefined8 *)(m2->v[2] + 2);
  local_38.t._4_8_ = *(undefined8 *)(m2->t + 1);
  local_38.v[1]._4_8_ = *(undefined8 *)(m2->v[1] + 1);
  local_38.v[2]._0_8_ = *(undefined8 *)m2->v[2];
  local_38.v[0]._0_8_ = *(undefined8 *)m2->v[0];
  local_38.v._8_8_ = *(undefined8 *)(m2->v[0] + 2);
LAB_00106238:
  lVar8 = 0;
  pMVar9 = out;
  do {
    pafVar1 = pMVar5->v + lVar8;
    lVar4 = 0;
    do {
      pMVar9->v[0][lVar4] =
           (*pafVar2)[lVar4] * (*pafVar1)[2] +
           pMVar6->v[0][lVar4] * (*pafVar1)[0] + (*pafVar7)[lVar4] * (*pafVar1)[1];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    out->t[lVar8] =
         pfVar3[2] * (*pafVar1)[2] + *pfVar3 * (*pafVar1)[0] + pfVar3[1] * (*pafVar1)[1] +
         pMVar5->t[lVar8];
    lVar8 = lVar8 + 1;
    pMVar9 = (MATRIX_f *)(pMVar9->v + 1);
  } while (lVar8 != 3);
  return;
}

Assistant:

void matrix_mul_f(const MATRIX_f *m1, const MATRIX_f *m2, MATRIX_f *out)
{
   MATRIX_f temp;
   int i, j;

   if (m1 == out) {
      temp = *m1;
      m1 = &temp;
   }
   else if (m2 == out) {
      temp = *m2;
      m2 = &temp;
   }

   for (i=0; i<3; i++) {
      for (j=0; j<3; j++) {
	 out->v[i][j] = (m1->v[0][j] * m2->v[i][0]) +
			(m1->v[1][j] * m2->v[i][1]) +
			(m1->v[2][j] * m2->v[i][2]);
      }

      out->t[i] = (m1->t[0] * m2->v[i][0]) +
		  (m1->t[1] * m2->v[i][1]) +
		  (m1->t[2] * m2->v[i][2]) +
		  m2->t[i];
   }
}